

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::init(CopyImageTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  deUint32 dVar2;
  deUint32 dVar3;
  int extraout_EAX;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  NotSupportedError *this_00;
  SeedBuilder *pSVar6;
  State *this_01;
  TestLog *log;
  SeedBuilder local_3c;
  deUint32 local_38;
  SeedBuilder builder;
  DefaultDeleter<glu::ContextInfo> local_21;
  undefined1 local_20 [6];
  bool isES32;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  CopyImageTest *this_local;
  
  ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
       this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  pCVar5 = glu::ContextInfo::create(pRVar4);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter(&local_21);
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20,pCVar5);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_38 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,(ApiType)local_38);
  if (!bVar1) {
    pCVar5 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
             operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                        local_20);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_copy_image");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Extension GL_EXT_copy_image not supported.","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                 ,0x784);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pCVar5 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
           operator*((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20
                    );
  dVar2 = ImageInfo::getFormat(&this->m_srcImageInfo);
  dVar3 = ImageInfo::getTarget(&this->m_srcImageInfo);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  checkFormatSupport(pCVar5,dVar2,dVar3,pRVar4);
  pCVar5 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
           operator*((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20
                    );
  dVar2 = ImageInfo::getFormat(&this->m_dstImageInfo);
  dVar3 = ImageInfo::getTarget(&this->m_dstImageInfo);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  checkFormatSupport(pCVar5,dVar2,dVar3,pRVar4);
  tcu::SeedBuilder::SeedBuilder(&local_3c);
  pSVar6 = tcu::operator<<(&local_3c,0xdcb2c);
  pSVar6 = anon_unknown_0::operator<<(pSVar6,&this->m_srcImageInfo);
  anon_unknown_0::operator<<(pSVar6,&this->m_dstImageInfo);
  this_01 = (State *)operator_new(0xf8);
  dVar2 = tcu::SeedBuilder::get(&local_3c);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  State::State(this_01,dVar2,log,pRVar4);
  this->m_state = this_01;
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20);
  return extraout_EAX;
}

Assistant:

void CopyImageTest::init (void)
{
	de::UniquePtr<glu::ContextInfo> ctxInfo(glu::ContextInfo::create(m_context.getRenderContext()));
	const bool						isES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!isES32 && !ctxInfo->isExtensionSupported("GL_EXT_copy_image"))
		throw tcu::NotSupportedError("Extension GL_EXT_copy_image not supported.", "", __FILE__, __LINE__);

	checkFormatSupport(*ctxInfo, m_srcImageInfo.getFormat(), m_srcImageInfo.getTarget(), m_context.getRenderContext());
	checkFormatSupport(*ctxInfo, m_dstImageInfo.getFormat(), m_dstImageInfo.getTarget(), m_context.getRenderContext());

	{
		SeedBuilder builder;

		builder << 903980
				<< m_srcImageInfo
				<< m_dstImageInfo;

		m_state = new State(builder.get(), m_testCtx.getLog(), m_context.getRenderContext());
	}
}